

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

size_t file_stdio_fwrite(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  int errnum;
  USERDATA *pUVar1;
  size_t sVar2;
  int *piVar3;
  
  pUVar1 = get_userdata(f);
  sVar2 = fwrite(ptr,1,size,(FILE *)pUVar1->fp);
  if (sVar2 < size) {
    piVar3 = __errno_location();
    errnum = *piVar3;
    pUVar1->errnum = errnum;
    al_set_errno(errnum);
  }
  return sVar2;
}

Assistant:

static size_t file_stdio_fwrite(ALLEGRO_FILE *f, const void *ptr, size_t size)
{
   USERDATA *userdata = get_userdata(f);
   size_t ret;

   ret = fwrite(ptr, 1, size, userdata->fp);
   if (ret < size) {
      userdata->errnum = errno;
      al_set_errno(errno);
   }

   return ret;
}